

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpu_data.h
# Opt level: O0

float * __thiscall dlib::gpu_data::device(gpu_data *this)

{
  ostream *poVar1;
  ostream *poVar2;
  string *a;
  undefined8 uVar3;
  ostringstream dlib_o_out;
  error_type t;
  ostringstream local_180 [384];
  
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar1 = std::operator<<((ostream *)local_180,"\n\nError detected at line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x6e);
  std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<((ostream *)local_180,"Error detected in file ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/gpu_data.h"
                          );
  std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<((ostream *)local_180,"Error detected in function ");
  poVar1 = std::operator<<(poVar1,"const float *dlib::gpu_data::device() const");
  std::operator<<(poVar1,".\n\n");
  poVar2 = std::operator<<((ostream *)local_180,"Failing expression was ");
  a = (string *)std::operator<<(poVar2,"false");
  t = (error_type)((ulong)poVar2 >> 0x20);
  std::operator<<((ostream *)a,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_180,std::boolalpha);
  poVar2 = std::operator<<(poVar2,"CUDA NOT ENABLED");
  std::operator<<(poVar2,"\n");
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar1,t,a);
  __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

const float* device() const 
        { 
#ifndef DLIB_USE_CUDA
            DLIB_CASSERT(false, "CUDA NOT ENABLED");
#endif
            copy_to_device();
            device_in_use = true;
            return data_device.get(); 
        }